

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::XmlReporter::assertionEnded(XmlReporter *this,AssertionStats *assertionStats)

{
  bool bVar1;
  uint uVar2;
  OfType OVar3;
  element_type *peVar4;
  string *psVar5;
  long in_RSI;
  long in_RDI;
  MessageInfo *msg;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *__range2;
  bool includeResults;
  AssertionResult *result;
  AssertionResult *in_stack_fffffffffffffba8;
  AssertionResult *in_stack_fffffffffffffbb0;
  string *in_stack_fffffffffffffbb8;
  XmlWriter *in_stack_fffffffffffffbc0;
  allocator *paVar6;
  string *in_stack_fffffffffffffbd0;
  XmlWriter *in_stack_fffffffffffffbd8;
  XmlWriter *in_stack_fffffffffffffbe0;
  AssertionResult *in_stack_fffffffffffffbe8;
  undefined8 in_stack_fffffffffffffbf0;
  undefined1 uVar7;
  AssertionResult *in_stack_fffffffffffffbf8;
  XmlWriter *in_stack_fffffffffffffc00;
  XmlWriter *this_00;
  string *in_stack_fffffffffffffc08;
  XmlWriter *in_stack_fffffffffffffc10;
  SourceLineInfo *in_stack_fffffffffffffc28;
  XmlReporter *in_stack_fffffffffffffc30;
  byte local_351;
  string local_350 [32];
  SourceLineInfo local_330;
  allocator local_319;
  string local_318 [32];
  string local_2f8 [39];
  undefined1 local_2d1 [41];
  undefined1 local_2a8 [55];
  allocator local_271;
  string local_270 [32];
  undefined1 local_250 [55];
  allocator local_219;
  string local_218 [32];
  string local_1f8 [39];
  undefined1 local_1d1 [41];
  string local_1a8 [39];
  allocator local_181;
  string local_180 [40];
  SourceLineInfo local_158;
  allocator local_129;
  string local_128 [39];
  allocator local_101;
  string local_100 [39];
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [63];
  allocator local_71;
  string local_70 [40];
  reference local_48;
  MessageInfo *local_40;
  __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
  local_38;
  long local_30;
  byte local_21;
  AssertionResult *local_20;
  long local_18;
  
  local_20 = (AssertionResult *)(in_RSI + 8);
  local_18 = in_RSI;
  peVar4 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x13c524);
  uVar2 = (*(peVar4->super_NonCopyable)._vptr_NonCopyable[5])();
  local_351 = 1;
  if ((uVar2 & 1) == 0) {
    bVar1 = AssertionResult::isOk(in_stack_fffffffffffffbb0);
    local_351 = bVar1 ^ 0xff;
  }
  local_21 = local_351 & 1;
  if (local_21 == 0) {
    OVar3 = AssertionResult::getResultType(local_20);
    uVar7 = (undefined1)((ulong)in_stack_fffffffffffffbf0 >> 0x38);
    if (OVar3 != Warning) goto LAB_0013c87d;
  }
  local_30 = local_18 + 0xa8;
  local_38._M_current =
       (MessageInfo *)
       clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::begin
                 ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
                  in_stack_fffffffffffffba8);
  local_40 = (MessageInfo *)
             clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::end
                       ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
                        in_stack_fffffffffffffba8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                        *)in_stack_fffffffffffffbb0,
                       (__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                        *)in_stack_fffffffffffffba8);
    uVar7 = (undefined1)((ulong)in_stack_fffffffffffffbf0 >> 0x38);
    if (!bVar1) break;
    local_48 = __gnu_cxx::
               __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
               ::operator*(&local_38);
    if ((local_48->type == Info) && ((local_21 & 1) != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_70,"Info",&local_71);
      XmlWriter::scopedElement(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
      XmlWriter::ScopedElement::writeText
                ((ScopedElement *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
                 SUB81((ulong)in_stack_fffffffffffffbb0 >> 0x38,0));
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffbb0);
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator((allocator<char> *)&local_71);
    }
    else if (local_48->type == Warning) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b0,"Warning",&local_b1);
      XmlWriter::scopedElement(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
      XmlWriter::ScopedElement::writeText
                ((ScopedElement *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
                 SUB81((ulong)in_stack_fffffffffffffbb0 >> 0x38,0));
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffbb0);
      std::__cxx11::string::~string(local_b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
    ::operator++(&local_38);
  }
LAB_0013c87d:
  if (((local_21 & 1) != 0) || (OVar3 = AssertionResult::getResultType(local_20), OVar3 == Warning))
  {
    bVar1 = AssertionResult::hasExpression((AssertionResult *)0x13c8b3);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d8,"Expression",&local_d9);
      XmlWriter::startElement
                ((XmlWriter *)in_stack_fffffffffffffbb0,(string *)in_stack_fffffffffffffba8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_100,"success",&local_101);
      AssertionResult::succeeded((AssertionResult *)0x13c964);
      XmlWriter::writeAttribute
                (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
                 SUB81((ulong)in_stack_fffffffffffffbb0 >> 0x38,0));
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_128,"type",&local_129);
      AssertionResult::getTestMacroName(in_stack_fffffffffffffba8);
      XmlWriter::writeAttribute<Catch::StringRef>
                (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                 (StringRef *)in_stack_fffffffffffffc00);
      StringRef::~StringRef((StringRef *)in_stack_fffffffffffffbb0);
      std::__cxx11::string::~string(local_128);
      std::allocator<char>::~allocator((allocator<char> *)&local_129);
      std::__cxx11::string::~string(local_100);
      std::allocator<char>::~allocator((allocator<char> *)&local_101);
      std::__cxx11::string::~string(local_d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_d9);
      local_158 = AssertionResult::getSourceInfo(local_20);
      writeSourceInfo(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
      in_stack_fffffffffffffc30 = (XmlReporter *)(in_RDI + 0x170);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_180,"Original",&local_181);
      XmlWriter::scopedElement(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
      AssertionResult::getExpression_abi_cxx11_(in_stack_fffffffffffffbf8);
      XmlWriter::ScopedElement::writeText
                ((ScopedElement *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
                 SUB81((ulong)in_stack_fffffffffffffbb0 >> 0x38,0));
      std::__cxx11::string::~string(local_1a8);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffbb0);
      std::__cxx11::string::~string(local_180);
      std::allocator<char>::~allocator((allocator<char> *)&local_181);
      in_stack_fffffffffffffc28 = (SourceLineInfo *)local_1d1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_1d1 + 1),"Expanded",(allocator *)in_stack_fffffffffffffc28);
      XmlWriter::scopedElement(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
      AssertionResult::getExpandedExpression_abi_cxx11_(in_stack_fffffffffffffbe8);
      XmlWriter::ScopedElement::writeText
                ((ScopedElement *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
                 SUB81((ulong)in_stack_fffffffffffffbb0 >> 0x38,0));
      std::__cxx11::string::~string(local_1f8);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffbb0);
      std::__cxx11::string::~string((string *)(local_1d1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_1d1);
    }
    OVar3 = AssertionResult::getResultType(local_20);
    if (OVar3 == Info) {
      psVar5 = (string *)local_2d1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)(local_2d1 + 1),"Info",(allocator *)psVar5);
      XmlWriter::scopedElement(in_stack_fffffffffffffbd8,psVar5);
      AssertionResult::getMessage_abi_cxx11_(in_stack_fffffffffffffba8);
      XmlWriter::ScopedElement::writeText
                ((ScopedElement *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
                 SUB81((ulong)in_stack_fffffffffffffbb0 >> 0x38,0));
      std::__cxx11::string::~string(local_2f8);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffbb0);
      std::__cxx11::string::~string((string *)(local_2d1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_2d1);
    }
    else if (OVar3 != Warning) {
      if (OVar3 == ExplicitFailure) {
        paVar6 = &local_319;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_318,"Failure",paVar6);
        XmlWriter::startElement
                  ((XmlWriter *)in_stack_fffffffffffffbb0,(string *)in_stack_fffffffffffffba8);
        std::__cxx11::string::~string(local_318);
        std::allocator<char>::~allocator((allocator<char> *)&local_319);
        local_330 = AssertionResult::getSourceInfo(local_20);
        writeSourceInfo(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
        AssertionResult::getMessage_abi_cxx11_((AssertionResult *)(in_RDI + 0x170));
        XmlWriter::writeText
                  (in_stack_fffffffffffffc00,(string *)in_stack_fffffffffffffbf8,(bool)uVar7);
        std::__cxx11::string::~string(local_350);
        XmlWriter::endElement(in_stack_fffffffffffffbe0);
      }
      else if (OVar3 == ThrewException) {
        paVar6 = &local_219;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_218,"Exception",paVar6);
        XmlWriter::startElement
                  ((XmlWriter *)in_stack_fffffffffffffbb0,(string *)in_stack_fffffffffffffba8);
        std::__cxx11::string::~string(local_218);
        std::allocator<char>::~allocator((allocator<char> *)&local_219);
        local_250._32_16_ = (undefined1  [16])AssertionResult::getSourceInfo(local_20);
        writeSourceInfo(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
        psVar5 = (string *)(in_RDI + 0x170);
        this_00 = (XmlWriter *)local_250;
        AssertionResult::getMessage_abi_cxx11_(in_stack_fffffffffffffba8);
        XmlWriter::writeText(this_00,psVar5,(bool)uVar7);
        std::__cxx11::string::~string((string *)local_250);
        XmlWriter::endElement(in_stack_fffffffffffffbe0);
      }
      else if (OVar3 == FatalErrorCondition) {
        paVar6 = &local_271;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_270,"FatalErrorCondition",paVar6);
        uVar7 = (undefined1)((ulong)paVar6 >> 0x38);
        XmlWriter::startElement
                  ((XmlWriter *)in_stack_fffffffffffffbb0,(string *)in_stack_fffffffffffffba8);
        std::__cxx11::string::~string(local_270);
        std::allocator<char>::~allocator((allocator<char> *)&local_271);
        local_2a8._32_16_ = (undefined1  [16])AssertionResult::getSourceInfo(local_20);
        writeSourceInfo(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
        in_stack_fffffffffffffbe0 = (XmlWriter *)local_2a8;
        AssertionResult::getMessage_abi_cxx11_(in_stack_fffffffffffffba8);
        XmlWriter::writeText
                  (in_stack_fffffffffffffc00,(string *)in_stack_fffffffffffffbf8,(bool)uVar7);
        std::__cxx11::string::~string((string *)local_2a8);
        XmlWriter::endElement(in_stack_fffffffffffffbe0);
      }
    }
    bVar1 = AssertionResult::hasExpression((AssertionResult *)0x13d45d);
    if (bVar1) {
      XmlWriter::endElement(in_stack_fffffffffffffbe0);
    }
  }
  return true;
}

Assistant:

bool XmlReporter::assertionEnded( AssertionStats const& assertionStats ) {

        AssertionResult const& result = assertionStats.assertionResult;

        bool includeResults = m_config->includeSuccessfulResults() || !result.isOk();

        if( includeResults || result.getResultType() == ResultWas::Warning ) {
            // Print any info messages in <Info> tags.
            for( auto const& msg : assertionStats.infoMessages ) {
                if( msg.type == ResultWas::Info && includeResults ) {
                    m_xml.scopedElement( "Info" )
                            .writeText( msg.message );
                } else if ( msg.type == ResultWas::Warning ) {
                    m_xml.scopedElement( "Warning" )
                            .writeText( msg.message );
                }
            }
        }

        // Drop out if result was successful but we're not printing them.
        if( !includeResults && result.getResultType() != ResultWas::Warning )
            return true;

        // Print the expression if there is one.
        if( result.hasExpression() ) {
            m_xml.startElement( "Expression" )
                .writeAttribute( "success", result.succeeded() )
                .writeAttribute( "type", result.getTestMacroName() );

            writeSourceInfo( result.getSourceInfo() );

            m_xml.scopedElement( "Original" )
                .writeText( result.getExpression() );
            m_xml.scopedElement( "Expanded" )
                .writeText( result.getExpandedExpression() );
        }

        // And... Print a result applicable to each result type.
        switch( result.getResultType() ) {
            case ResultWas::ThrewException:
                m_xml.startElement( "Exception" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            case ResultWas::FatalErrorCondition:
                m_xml.startElement( "FatalErrorCondition" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            case ResultWas::Info:
                m_xml.scopedElement( "Info" )
                    .writeText( result.getMessage() );
                break;
            case ResultWas::Warning:
                // Warning will already have been written
                break;
            case ResultWas::ExplicitFailure:
                m_xml.startElement( "Failure" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            default:
                break;
        }

        if( result.hasExpression() )
            m_xml.endElement();

        return true;
    }